

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall llvm::cl::extrahelp::extrahelp(extrahelp *this,StringRef Help)

{
  CommandLineParser *pCVar1;
  value_type local_18;
  
  local_18.Length = Help.Length;
  local_18.Data = Help.Data;
  (this->morehelp).Data = local_18.Data;
  (this->morehelp).Length = local_18.Length;
  pCVar1 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                         *)this);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
            (&pCVar1->MoreHelp,&local_18);
  return;
}

Assistant:

extrahelp::extrahelp(StringRef Help) : morehelp(Help) {
  GlobalParser->MoreHelp.push_back(Help);
}